

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

void __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::DeleteKey
          (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,Addr p)

{
  string local_e8 [32];
  Addr local_c8;
  undefined1 local_c0 [8];
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> C;
  string local_48 [32];
  Addr local_28;
  Addr pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  Addr p_local;
  
  pos = (Addr)k;
  std::__cxx11::string::string(local_48,(string *)k);
  local_28 = FindLeafAddr(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_48,p);
  std::__cxx11::string::~string(local_48);
  if (local_28.FileOff != -1) {
    IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    IndexNode((IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_c0,this->N);
    local_c8 = local_28;
    FindNode(this,local_28,
             (IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_c0);
    std::__cxx11::string::string(local_e8,(string *)k);
    Delete_Aux(this,(IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,p);
    std::__cxx11::string::~string(local_e8);
    IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~IndexNode((IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_c0);
  }
  return;
}

Assistant:

void BpTree<K>::DeleteKey(K k, Addr p) {
	Addr pos = this->FindLeafAddr(k, p);
	if (pos.FileOff != -1) {
		IndexNode<K> C(N);
		this->FindNode(pos, C);
		this->Delete_Aux(C, k, p);
	}
	else
		//cout << "Cannot find the key!" << endl;
	return;
}